

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O0

cmDependInformation * __thiscall
anon_unknown.dwarf_9c9121::cmLBDepend::GetDependInformation
          (cmLBDepend *this,string *file,string *extraPath)

{
  bool bVar1;
  pointer ppVar2;
  pointer pcVar3;
  mapped_type *this_00;
  string local_a0;
  cmLBDepend *local_80;
  cmDependInformation *ptr;
  __single_object info;
  _Self local_68 [3];
  _Self local_50;
  iterator result;
  string fullPath;
  string *extraPath_local;
  string *file_local;
  cmLBDepend *this_local;
  
  FullPath((string *)&result,this,file,extraPath);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
       ::find(&this->DependInformationMap,(string *)&result);
  local_68[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
       ::end(&this->DependInformationMap);
  bVar1 = std::operator!=(&local_50,local_68);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>
             ::operator->(&local_50);
    this_local = (cmLBDepend *)
                 std::
                 unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
                 ::get(&ppVar2->second);
    info._M_t.
    super___uniq_ptr_impl<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
    ._M_t.
    super__Tuple_impl<0UL,_(anonymous_namespace)::cmDependInformation_*,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
    .super__Head_base<0UL,_(anonymous_namespace)::cmDependInformation_*,_false>._M_head_impl._4_4_ =
         1;
  }
  else {
    std::make_unique<(anonymous_namespace)::cmDependInformation>();
    local_80 = (cmLBDepend *)
               std::
               unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
               ::get((unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
                      *)&ptr);
    pcVar3 = std::
             unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
             ::operator->((unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
                           *)&ptr);
    std::__cxx11::string::operator=((string *)&pcVar3->FullPath,(string *)&result);
    cmsys::SystemTools::GetFilenamePath(&local_a0,(string *)&result);
    pcVar3 = std::
             unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
             ::operator->((unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
                           *)&ptr);
    std::__cxx11::string::operator=((string *)&pcVar3->PathOnly,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    pcVar3 = std::
             unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
             ::operator->((unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
                           *)&ptr);
    std::__cxx11::string::operator=((string *)&pcVar3->IncludeName,(string *)file);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
              ::operator[](&this->DependInformationMap,(key_type *)&result);
    std::
    unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
    ::operator=(this_00,(unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
                         *)&ptr);
    this_local = local_80;
    info._M_t.
    super___uniq_ptr_impl<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
    ._M_t.
    super__Tuple_impl<0UL,_(anonymous_namespace)::cmDependInformation_*,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
    .super__Head_base<0UL,_(anonymous_namespace)::cmDependInformation_*,_false>._M_head_impl._4_4_ =
         1;
    std::
    unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
    ::~unique_ptr((unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
                   *)&ptr);
  }
  std::__cxx11::string::~string((string *)&result);
  return (cmDependInformation *)this_local;
}

Assistant:

cmDependInformation* GetDependInformation(const std::string& file,
                                            const std::string& extraPath)
  {
    // Get the full path for the file so that lookup is unambiguous.
    std::string fullPath = this->FullPath(file, extraPath);

    // Try to find the file's instance of cmDependInformation.
    auto result = this->DependInformationMap.find(fullPath);
    if (result != this->DependInformationMap.end()) {
      // Found an instance, return it.
      return result->second.get();
    }
    // Didn't find an instance.  Create a new one and save it.
    auto info = cm::make_unique<cmDependInformation>();
    auto* ptr = info.get();
    info->FullPath = fullPath;
    info->PathOnly = cmSystemTools::GetFilenamePath(fullPath);
    info->IncludeName = file;
    this->DependInformationMap[fullPath] = std::move(info);
    return ptr;
  }